

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O0

void m256v_copy_row(m256v *M1,int r1,m256v *Mt,int rt)

{
  int in_ECX;
  m256v *in_RDX;
  int i;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  m256v *pmVar1;
  int r;
  int iVar2;
  int iVar3;
  
  r = 0;
  while (r < in_RDX->n_col) {
    pmVar1 = in_RDX;
    iVar2 = r;
    iVar3 = in_ECX;
    m256v_get_el(in_RDX,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    m256v_set_el((m256v *)CONCAT44(iVar3,iVar2),r,in_ECX,(uint8_t)((ulong)pmVar1 >> 0x38));
    in_ECX = iVar3;
    r = iVar2 + 1;
  }
  return;
}

Assistant:

void m256v_copy_row(const m256v* M1,
			int r1,
			m256v* Mt,
			int rt)
{
	assert (M1->n_col == Mt->n_col);

	for (int i = 0; i < Mt->n_col; ++i) {
		set_el(Mt, rt, i, get_el(M1, r1, i));
	}
}